

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O3

int test_crop_4(void)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  uint uVar2;
  void *ptr_23;
  void *ptr_21;
  void *ptr_20;
  void *ptr_18;
  void *ptr_17;
  void *ptr_15;
  void *ptr_14;
  void *ptr_12;
  void *ptr_11;
  void *ptr_9;
  void *ptr_8;
  void *ptr_6;
  void *ptr_5;
  void *ptr_3;
  void *ptr_2;
  void *ptr;
  void *ptr_22;
  void *ptr_19;
  void *ptr_16;
  void *ptr_13;
  void *ptr_10;
  void *ptr_7;
  void *ptr_4;
  void *ptr_1;
  Mat m;
  undefined8 *local_678;
  Mat local_670;
  Mat local_630;
  Mat local_5f0;
  Mat local_5b0;
  Mat local_570;
  Mat local_530;
  Mat local_4f0;
  Mat local_4b0;
  Mat local_470;
  Mat local_430;
  Mat local_3f0;
  Mat local_3b0;
  Mat local_370;
  Mat local_330;
  Mat local_2f0;
  Mat local_2b0;
  Mat local_270;
  Mat local_230;
  Mat local_1f0;
  Mat local_1b0;
  Mat local_170;
  Mat local_130;
  Mat local_f0;
  Mat local_b0;
  Mat local_70;
  
  RandomMat(&local_70,0x11,in_EDX,in_ECX);
  local_b0.elemsize = 4;
  local_b0.elempack = 1;
  local_b0.allocator = (Allocator *)0x0;
  local_b0.dims = 1;
  local_b0.w = 3;
  local_b0.h = 1;
  local_b0.c = 1;
  local_b0.cstep = 3;
  local_2f0.data = (undefined8 *)0x0;
  iVar1 = posix_memalign(&local_2f0.data,0x10,0x10);
  local_b0.data = (undefined8 *)0x0;
  if (iVar1 == 0) {
    local_b0.data = local_2f0.data;
  }
  local_b0.refcount = (int *)((long)local_b0.data + 0xc);
  *(undefined8 *)local_b0.data = 0;
  *(undefined8 *)((long)local_b0.data + 8) = 0x100000000;
  local_2f0.elemsize = 4;
  local_2f0.elempack = 1;
  local_2f0.allocator = (Allocator *)0x0;
  local_2f0.dims = 1;
  local_2f0.w = 3;
  local_2f0.h = 1;
  local_2f0.c = 1;
  local_2f0.cstep = 3;
  local_f0.data = (undefined8 *)0x0;
  iVar1 = posix_memalign(&local_f0.data,0x10,0x10);
  local_2f0.data = (undefined8 *)0x0;
  if (iVar1 == 0) {
    local_2f0.data = local_f0.data;
  }
  local_2f0.refcount = (int *)((long)local_2f0.data + 0xc);
  *(undefined8 *)local_2f0.data = 0x6400000064;
  *(undefined8 *)((long)local_2f0.data + 8) = 0x100000064;
  local_f0.elemsize = 4;
  local_f0.elempack = 1;
  local_f0.allocator = (Allocator *)0x0;
  local_f0.dims = 1;
  local_f0.w = 3;
  local_f0.h = 1;
  local_f0.c = 1;
  local_f0.cstep = 3;
  local_330.data = (undefined8 *)0x0;
  iVar1 = posix_memalign(&local_330.data,0x10,0x10);
  local_f0.data = (undefined8 *)0x0;
  if (iVar1 == 0) {
    local_f0.data = local_330.data;
  }
  local_f0.refcount = (int *)((long)local_f0.data + 0xc);
  *(undefined8 *)local_f0.data = 0x100000000;
  *(undefined8 *)((long)local_f0.data + 8) = 0x100000002;
  iVar1 = test_crop(&local_70,&local_b0,&local_2f0,&local_f0);
  uVar2 = 1;
  if (iVar1 == 0) {
    local_330.elemsize = 4;
    local_330.elempack = 1;
    local_330.allocator = (Allocator *)0x0;
    local_330.dims = 1;
    local_330.w = 1;
    local_330.h = 1;
    local_330.c = 1;
    local_330.cstep = 1;
    local_370.data = (undefined8 *)0x0;
    iVar1 = posix_memalign(&local_370.data,0x10,8);
    local_330.data = (undefined8 *)0x0;
    if (iVar1 == 0) {
      local_330.data = local_370.data;
    }
    local_330.refcount = (int *)((long)local_330.data + 4);
    *(undefined8 *)local_330.data = 0x100000004;
    local_370.elemsize = 4;
    local_370.elempack = 1;
    local_370.allocator = (Allocator *)0x0;
    local_370.dims = 1;
    local_370.w = 1;
    local_370.h = 1;
    local_370.c = 1;
    local_370.cstep = 1;
    local_130.data = (undefined8 *)0x0;
    iVar1 = posix_memalign(&local_130.data,0x10,8);
    local_370.data = (undefined8 *)0x0;
    if (iVar1 == 0) {
      local_370.data = local_130.data;
    }
    local_370.refcount = (int *)((long)local_370.data + 4);
    *(undefined8 *)local_370.data = 0x100000008;
    local_130.elemsize = 4;
    local_130.elempack = 1;
    local_130.allocator = (Allocator *)0x0;
    local_130.dims = 1;
    local_130.w = 1;
    local_130.h = 1;
    local_130.c = 1;
    local_130.cstep = 1;
    local_3b0.data = (undefined8 *)0x0;
    iVar1 = posix_memalign(&local_3b0.data,0x10,8);
    local_130.data = (undefined8 *)0x0;
    if (iVar1 == 0) {
      local_130.data = local_3b0.data;
    }
    local_130.refcount = (int *)((long)local_130.data + 4);
    *(undefined8 *)local_130.data = 0x100000000;
    iVar1 = test_crop(&local_70,&local_330,&local_370,&local_130);
    uVar2 = 1;
    if (iVar1 == 0) {
      local_3b0.elemsize = 4;
      local_3b0.elempack = 1;
      local_3b0.allocator = (Allocator *)0x0;
      local_3b0.dims = 1;
      local_3b0.w = 1;
      local_3b0.h = 1;
      local_3b0.c = 1;
      local_3b0.cstep = 1;
      local_3f0.data = (undefined8 *)0x0;
      iVar1 = posix_memalign(&local_3f0.data,0x10,8);
      local_3b0.data = (undefined8 *)0x0;
      if (iVar1 == 0) {
        local_3b0.data = local_3f0.data;
      }
      local_3b0.refcount = (int *)((long)local_3b0.data + 4);
      *(undefined8 *)local_3b0.data = 0x100000002;
      local_3f0.elemsize = 4;
      local_3f0.elempack = 1;
      local_3f0.allocator = (Allocator *)0x0;
      local_3f0.dims = 1;
      local_3f0.w = 1;
      local_3f0.h = 1;
      local_3f0.c = 1;
      local_3f0.cstep = 1;
      local_170.data = (undefined8 *)0x0;
      iVar1 = posix_memalign(&local_170.data,0x10,8);
      local_3f0.data = (undefined8 *)0x0;
      if (iVar1 == 0) {
        local_3f0.data = local_170.data;
      }
      local_3f0.refcount = (int *)((long)local_3f0.data + 4);
      *(undefined8 *)local_3f0.data = 0x100000007;
      local_170.elemsize = 4;
      local_170.elempack = 1;
      local_170.allocator = (Allocator *)0x0;
      local_170.dims = 1;
      local_170.w = 1;
      local_170.h = 1;
      local_170.c = 1;
      local_170.cstep = 1;
      local_430.data = (undefined8 *)0x0;
      iVar1 = posix_memalign(&local_430.data,0x10,8);
      local_170.data = (undefined8 *)0x0;
      if (iVar1 == 0) {
        local_170.data = local_430.data;
      }
      local_170.refcount = (int *)((long)local_170.data + 4);
      *(undefined8 *)local_170.data = 0x100000001;
      iVar1 = test_crop(&local_70,&local_3b0,&local_3f0,&local_170);
      uVar2 = 1;
      if (iVar1 == 0) {
        local_430.elemsize = 4;
        local_430.elempack = 1;
        local_430.allocator = (Allocator *)0x0;
        local_430.dims = 1;
        local_430.w = 1;
        local_430.h = 1;
        local_430.c = 1;
        local_430.cstep = 1;
        local_470.data = (undefined8 *)0x0;
        iVar1 = posix_memalign(&local_470.data,0x10,8);
        local_430.data = (undefined8 *)0x0;
        if (iVar1 == 0) {
          local_430.data = local_470.data;
        }
        local_430.refcount = (int *)((long)local_430.data + 4);
        *(undefined8 *)local_430.data = 0x100000003;
        local_470.elemsize = 4;
        local_470.elempack = 1;
        local_470.allocator = (Allocator *)0x0;
        local_470.dims = 1;
        local_470.w = 1;
        local_470.h = 1;
        local_470.c = 1;
        local_470.cstep = 1;
        local_1b0.data = (undefined8 *)0x0;
        iVar1 = posix_memalign(&local_1b0.data,0x10,8);
        local_470.data = (undefined8 *)0x0;
        if (iVar1 == 0) {
          local_470.data = local_1b0.data;
        }
        local_470.refcount = (int *)((long)local_470.data + 4);
        *(undefined8 *)local_470.data = 0x100000005;
        local_1b0.elemsize = 4;
        local_1b0.elempack = 1;
        local_1b0.allocator = (Allocator *)0x0;
        local_1b0.dims = 1;
        local_1b0.w = 1;
        local_1b0.h = 1;
        local_1b0.c = 1;
        local_1b0.cstep = 1;
        local_4b0.data = (undefined8 *)0x0;
        iVar1 = posix_memalign(&local_4b0.data,0x10,8);
        local_1b0.data = (undefined8 *)0x0;
        if (iVar1 == 0) {
          local_1b0.data = local_4b0.data;
        }
        local_1b0.refcount = (int *)((long)local_1b0.data + 4);
        *(undefined8 *)local_1b0.data = 0x100000002;
        iVar1 = test_crop(&local_70,&local_430,&local_470,&local_1b0);
        uVar2 = 1;
        if (iVar1 == 0) {
          local_4b0.elemsize = 4;
          local_4b0.elempack = 1;
          local_4b0.allocator = (Allocator *)0x0;
          local_4b0.dims = 1;
          local_4b0.w = 2;
          local_4b0.h = 1;
          local_4b0.c = 1;
          local_4b0.cstep = 2;
          local_4f0.data = (undefined8 *)0x0;
          iVar1 = posix_memalign(&local_4f0.data,0x10,0xc);
          local_4b0.data = (undefined8 *)0x0;
          if (iVar1 == 0) {
            local_4b0.data = local_4f0.data;
          }
          local_4b0.refcount = (int *)((long)local_4b0.data + 8);
          *(undefined4 *)((long)local_4b0.data + 8) = 1;
          *(undefined8 *)local_4b0.data = 0x100000002;
          local_4f0.elemsize = 4;
          local_4f0.elempack = 1;
          local_4f0.allocator = (Allocator *)0x0;
          local_4f0.dims = 1;
          local_4f0.w = 2;
          local_4f0.h = 1;
          local_4f0.c = 1;
          local_4f0.cstep = 2;
          local_1f0.data = (undefined8 *)0x0;
          iVar1 = posix_memalign(&local_1f0.data,0x10,0xc);
          local_4f0.data = (undefined8 *)0x0;
          if (iVar1 == 0) {
            local_4f0.data = local_1f0.data;
          }
          local_4f0.refcount = (int *)((long)local_4f0.data + 8);
          *(undefined4 *)((long)local_4f0.data + 8) = 1;
          *(undefined8 *)local_4f0.data = 0xfffffffe00000004;
          local_1f0.elemsize = 4;
          local_1f0.elempack = 1;
          local_1f0.allocator = (Allocator *)0x0;
          local_1f0.dims = 1;
          local_1f0.w = 2;
          local_1f0.h = 1;
          local_1f0.c = 1;
          local_1f0.cstep = 2;
          local_530.data = (undefined8 *)0x0;
          iVar1 = posix_memalign(&local_530.data,0x10,0xc);
          local_1f0.data = (undefined8 *)0x0;
          if (iVar1 == 0) {
            local_1f0.data = local_530.data;
          }
          local_1f0.refcount = (int *)((long)local_1f0.data + 8);
          *(undefined4 *)((long)local_1f0.data + 8) = 1;
          *(undefined8 *)local_1f0.data = 0x100000000;
          iVar1 = test_crop(&local_70,&local_4b0,&local_4f0,&local_1f0);
          uVar2 = 1;
          if (iVar1 == 0) {
            local_530.elemsize = 4;
            local_530.elempack = 1;
            local_530.allocator = (Allocator *)0x0;
            local_530.dims = 1;
            local_530.w = 2;
            local_530.h = 1;
            local_530.c = 1;
            local_530.cstep = 2;
            local_570.data = (undefined8 *)0x0;
            iVar1 = posix_memalign(&local_570.data,0x10,0xc);
            local_530.data = (undefined8 *)0x0;
            if (iVar1 == 0) {
              local_530.data = local_570.data;
            }
            local_530.refcount = (int *)((long)local_530.data + 8);
            *(undefined4 *)((long)local_530.data + 8) = 1;
            *(undefined8 *)local_530.data = 0x400000001;
            local_570.elemsize = 4;
            local_570.elempack = 1;
            local_570.allocator = (Allocator *)0x0;
            local_570.dims = 1;
            local_570.w = 2;
            local_570.h = 1;
            local_570.c = 1;
            local_570.cstep = 2;
            local_230.data = (undefined8 *)0x0;
            iVar1 = posix_memalign(&local_230.data,0x10,0xc);
            local_570.data = (undefined8 *)0x0;
            if (iVar1 == 0) {
              local_570.data = local_230.data;
            }
            local_570.refcount = (int *)((long)local_570.data + 8);
            *(undefined4 *)((long)local_570.data + 8) = 1;
            *(undefined8 *)local_570.data = 0x7fffffffb;
            local_230.elemsize = 4;
            local_230.elempack = 1;
            local_230.allocator = (Allocator *)0x0;
            local_230.dims = 1;
            local_230.w = 2;
            local_230.h = 1;
            local_230.c = 1;
            local_230.cstep = 2;
            local_5b0.data = (undefined8 *)0x0;
            iVar1 = posix_memalign(&local_5b0.data,0x10,0xc);
            local_230.data = (undefined8 *)0x0;
            if (iVar1 == 0) {
              local_230.data = local_5b0.data;
            }
            local_230.refcount = (int *)((long)local_230.data + 8);
            *(undefined4 *)((long)local_230.data + 8) = 1;
            *(undefined8 *)local_230.data = 0xfffffffd00000001;
            iVar1 = test_crop(&local_70,&local_530,&local_570,&local_230);
            uVar2 = 1;
            if (iVar1 == 0) {
              local_5b0.elemsize = 4;
              local_5b0.elempack = 1;
              local_5b0.allocator = (Allocator *)0x0;
              local_5b0.dims = 1;
              local_5b0.w = 2;
              local_5b0.h = 1;
              local_5b0.c = 1;
              local_5b0.cstep = 2;
              local_5f0.data = (undefined8 *)0x0;
              iVar1 = posix_memalign(&local_5f0.data,0x10,0xc);
              local_5b0.data = (undefined8 *)0x0;
              if (iVar1 == 0) {
                local_5b0.data = local_5f0.data;
              }
              local_5b0.refcount = (int *)((long)local_5b0.data + 8);
              *(undefined4 *)((long)local_5b0.data + 8) = 1;
              *(undefined8 *)local_5b0.data = 0x100000002;
              local_5f0.elemsize = 4;
              local_5f0.elempack = 1;
              local_5f0.allocator = (Allocator *)0x0;
              local_5f0.dims = 1;
              local_5f0.w = 2;
              local_5f0.h = 1;
              local_5f0.c = 1;
              local_5f0.cstep = 2;
              local_270.data = (undefined8 *)0x0;
              iVar1 = posix_memalign(&local_270.data,0x10,0xc);
              local_5f0.data = (undefined8 *)0x0;
              if (iVar1 == 0) {
                local_5f0.data = local_270.data;
              }
              local_5f0.refcount = (int *)((long)local_5f0.data + 8);
              *(undefined4 *)((long)local_5f0.data + 8) = 1;
              *(undefined8 *)local_5f0.data = 0xfffffffe00000004;
              local_270.elemsize = 4;
              local_270.elempack = 1;
              local_270.allocator = (Allocator *)0x0;
              local_270.dims = 1;
              local_270.w = 2;
              local_270.h = 1;
              local_270.c = 1;
              local_270.cstep = 2;
              local_630.data = (undefined8 *)0x0;
              iVar1 = posix_memalign(&local_630.data,0x10,0xc);
              local_270.data = (undefined8 *)0x0;
              if (iVar1 == 0) {
                local_270.data = local_630.data;
              }
              local_270.refcount = (int *)((long)local_270.data + 8);
              *(undefined4 *)((long)local_270.data + 8) = 1;
              *(undefined8 *)local_270.data = 0xfffffffeffffffff;
              iVar1 = test_crop(&local_70,&local_5b0,&local_5f0,&local_270);
              uVar2 = 1;
              if (iVar1 == 0) {
                local_630.elemsize = 4;
                local_630.elempack = 1;
                local_630.allocator = (Allocator *)0x0;
                local_630.dims = 1;
                local_630.w = 3;
                local_630.h = 1;
                local_630.c = 1;
                local_630.cstep = 3;
                local_670.data = (undefined8 *)0x0;
                iVar1 = posix_memalign(&local_670.data,0x10,0x10);
                local_630.data = (undefined8 *)0x0;
                if (iVar1 == 0) {
                  local_630.data = local_670.data;
                }
                local_630.refcount = (int *)((long)local_630.data + 0xc);
                *(undefined8 *)local_630.data = 0x200000001;
                *(undefined8 *)((long)local_630.data + 8) = 0x100000003;
                local_670.elemsize = 4;
                local_670.elempack = 1;
                local_670.allocator = (Allocator *)0x0;
                local_670.dims = 1;
                local_670.w = 3;
                local_670.h = 1;
                local_670.c = 1;
                local_670.cstep = 3;
                local_2b0.data = (undefined8 *)0x0;
                iVar1 = posix_memalign(&local_2b0.data,0x10,0x10);
                local_670.data = (undefined8 *)0x0;
                if (iVar1 == 0) {
                  local_670.data = local_2b0.data;
                }
                local_670.refcount = (int *)((long)local_670.data + 0xc);
                *(undefined8 *)local_670.data = 0xfffffffefffffffd;
                *(undefined8 *)((long)local_670.data + 8) = 0x1ffffffff;
                local_2b0.elemsize = 4;
                local_2b0.elempack = 1;
                local_2b0.allocator = (Allocator *)0x0;
                local_2b0.dims = 1;
                local_2b0.w = 3;
                local_2b0.h = 1;
                local_2b0.c = 1;
                local_2b0.cstep = 3;
                local_678 = (undefined8 *)0x0;
                iVar1 = posix_memalign(&local_678,0x10,0x10);
                local_2b0.data = (undefined8 *)0x0;
                if (iVar1 == 0) {
                  local_2b0.data = local_678;
                }
                local_2b0.refcount = (int *)((long)local_2b0.data + 0xc);
                *(undefined8 *)local_2b0.data = 0xfffffffefffffffd;
                *(undefined8 *)((long)local_2b0.data + 8) = 0x1ffffffff;
                iVar1 = test_crop(&local_70,&local_630,&local_670,&local_2b0);
                if (local_2b0.refcount != (int *)0x0) {
                  LOCK();
                  *local_2b0.refcount = *local_2b0.refcount + -1;
                  UNLOCK();
                  if (*local_2b0.refcount == 0) {
                    if (local_2b0.allocator == (Allocator *)0x0) {
                      if ((undefined8 *)local_2b0.data != (undefined8 *)0x0) {
                        free(local_2b0.data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_2b0.allocator + 0x18))();
                    }
                  }
                }
                if (local_670.refcount != (int *)0x0) {
                  LOCK();
                  *local_670.refcount = *local_670.refcount + -1;
                  UNLOCK();
                  if (*local_670.refcount == 0) {
                    if (local_670.allocator == (Allocator *)0x0) {
                      if ((undefined8 *)local_670.data != (undefined8 *)0x0) {
                        free(local_670.data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_670.allocator + 0x18))();
                    }
                  }
                }
                if (local_630.refcount != (int *)0x0) {
                  LOCK();
                  *local_630.refcount = *local_630.refcount + -1;
                  UNLOCK();
                  if (*local_630.refcount == 0) {
                    if (local_630.allocator == (Allocator *)0x0) {
                      if ((undefined8 *)local_630.data != (undefined8 *)0x0) {
                        free(local_630.data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_630.allocator + 0x18))();
                    }
                  }
                }
                uVar2 = (uint)(iVar1 != 0);
              }
              if (local_270.refcount != (int *)0x0) {
                LOCK();
                *local_270.refcount = *local_270.refcount + -1;
                UNLOCK();
                if (*local_270.refcount == 0) {
                  if (local_270.allocator == (Allocator *)0x0) {
                    if ((undefined8 *)local_270.data != (undefined8 *)0x0) {
                      free(local_270.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_270.allocator + 0x18))();
                  }
                }
              }
              if (local_5f0.refcount != (int *)0x0) {
                LOCK();
                *local_5f0.refcount = *local_5f0.refcount + -1;
                UNLOCK();
                if (*local_5f0.refcount == 0) {
                  if (local_5f0.allocator == (Allocator *)0x0) {
                    if ((undefined8 *)local_5f0.data != (undefined8 *)0x0) {
                      free(local_5f0.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_5f0.allocator + 0x18))();
                  }
                }
              }
              if (local_5b0.refcount != (int *)0x0) {
                LOCK();
                *local_5b0.refcount = *local_5b0.refcount + -1;
                UNLOCK();
                if (*local_5b0.refcount == 0) {
                  if (local_5b0.allocator == (Allocator *)0x0) {
                    if ((undefined8 *)local_5b0.data != (undefined8 *)0x0) {
                      free(local_5b0.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_5b0.allocator + 0x18))();
                  }
                }
              }
            }
            if (local_230.refcount != (int *)0x0) {
              LOCK();
              *local_230.refcount = *local_230.refcount + -1;
              UNLOCK();
              if (*local_230.refcount == 0) {
                if (local_230.allocator == (Allocator *)0x0) {
                  if ((undefined8 *)local_230.data != (undefined8 *)0x0) {
                    free(local_230.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_230.allocator + 0x18))();
                }
              }
            }
            if (local_570.refcount != (int *)0x0) {
              LOCK();
              *local_570.refcount = *local_570.refcount + -1;
              UNLOCK();
              if (*local_570.refcount == 0) {
                if (local_570.allocator == (Allocator *)0x0) {
                  if ((undefined8 *)local_570.data != (undefined8 *)0x0) {
                    free(local_570.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_570.allocator + 0x18))();
                }
              }
            }
            if (local_530.refcount != (int *)0x0) {
              LOCK();
              *local_530.refcount = *local_530.refcount + -1;
              UNLOCK();
              if (*local_530.refcount == 0) {
                if (local_530.allocator == (Allocator *)0x0) {
                  if ((undefined8 *)local_530.data != (undefined8 *)0x0) {
                    free(local_530.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_530.allocator + 0x18))();
                }
              }
            }
          }
          if (local_1f0.refcount != (int *)0x0) {
            LOCK();
            *local_1f0.refcount = *local_1f0.refcount + -1;
            UNLOCK();
            if (*local_1f0.refcount == 0) {
              if (local_1f0.allocator == (Allocator *)0x0) {
                if ((undefined8 *)local_1f0.data != (undefined8 *)0x0) {
                  free(local_1f0.data);
                }
              }
              else {
                (**(code **)(*(long *)local_1f0.allocator + 0x18))();
              }
            }
          }
          if (local_4f0.refcount != (int *)0x0) {
            LOCK();
            *local_4f0.refcount = *local_4f0.refcount + -1;
            UNLOCK();
            if (*local_4f0.refcount == 0) {
              if (local_4f0.allocator == (Allocator *)0x0) {
                if ((undefined8 *)local_4f0.data != (undefined8 *)0x0) {
                  free(local_4f0.data);
                }
              }
              else {
                (**(code **)(*(long *)local_4f0.allocator + 0x18))();
              }
            }
          }
          if (local_4b0.refcount != (int *)0x0) {
            LOCK();
            *local_4b0.refcount = *local_4b0.refcount + -1;
            UNLOCK();
            if (*local_4b0.refcount == 0) {
              if (local_4b0.allocator == (Allocator *)0x0) {
                if ((undefined8 *)local_4b0.data != (undefined8 *)0x0) {
                  free(local_4b0.data);
                }
              }
              else {
                (**(code **)(*(long *)local_4b0.allocator + 0x18))();
              }
            }
          }
        }
        if (local_1b0.refcount != (int *)0x0) {
          LOCK();
          *local_1b0.refcount = *local_1b0.refcount + -1;
          UNLOCK();
          if (*local_1b0.refcount == 0) {
            if (local_1b0.allocator == (Allocator *)0x0) {
              if ((undefined8 *)local_1b0.data != (undefined8 *)0x0) {
                free(local_1b0.data);
              }
            }
            else {
              (**(code **)(*(long *)local_1b0.allocator + 0x18))();
            }
          }
        }
        if (local_470.refcount != (int *)0x0) {
          LOCK();
          *local_470.refcount = *local_470.refcount + -1;
          UNLOCK();
          if (*local_470.refcount == 0) {
            if (local_470.allocator == (Allocator *)0x0) {
              if ((undefined8 *)local_470.data != (undefined8 *)0x0) {
                free(local_470.data);
              }
            }
            else {
              (**(code **)(*(long *)local_470.allocator + 0x18))();
            }
          }
        }
        if (local_430.refcount != (int *)0x0) {
          LOCK();
          *local_430.refcount = *local_430.refcount + -1;
          UNLOCK();
          if (*local_430.refcount == 0) {
            if (local_430.allocator == (Allocator *)0x0) {
              if ((undefined8 *)local_430.data != (undefined8 *)0x0) {
                free(local_430.data);
              }
            }
            else {
              (**(code **)(*(long *)local_430.allocator + 0x18))();
            }
          }
        }
      }
      if (local_170.refcount != (int *)0x0) {
        LOCK();
        *local_170.refcount = *local_170.refcount + -1;
        UNLOCK();
        if (*local_170.refcount == 0) {
          if (local_170.allocator == (Allocator *)0x0) {
            if ((undefined8 *)local_170.data != (undefined8 *)0x0) {
              free(local_170.data);
            }
          }
          else {
            (**(code **)(*(long *)local_170.allocator + 0x18))();
          }
        }
      }
      if (local_3f0.refcount != (int *)0x0) {
        LOCK();
        *local_3f0.refcount = *local_3f0.refcount + -1;
        UNLOCK();
        if (*local_3f0.refcount == 0) {
          if (local_3f0.allocator == (Allocator *)0x0) {
            if ((undefined8 *)local_3f0.data != (undefined8 *)0x0) {
              free(local_3f0.data);
            }
          }
          else {
            (**(code **)(*(long *)local_3f0.allocator + 0x18))();
          }
        }
      }
      if (local_3b0.refcount != (int *)0x0) {
        LOCK();
        *local_3b0.refcount = *local_3b0.refcount + -1;
        UNLOCK();
        if (*local_3b0.refcount == 0) {
          if (local_3b0.allocator == (Allocator *)0x0) {
            if ((undefined8 *)local_3b0.data != (undefined8 *)0x0) {
              free(local_3b0.data);
            }
          }
          else {
            (**(code **)(*(long *)local_3b0.allocator + 0x18))();
          }
        }
      }
    }
    if (local_130.refcount != (int *)0x0) {
      LOCK();
      *local_130.refcount = *local_130.refcount + -1;
      UNLOCK();
      if (*local_130.refcount == 0) {
        if (local_130.allocator == (Allocator *)0x0) {
          if ((undefined8 *)local_130.data != (undefined8 *)0x0) {
            free(local_130.data);
          }
        }
        else {
          (**(code **)(*(long *)local_130.allocator + 0x18))();
        }
      }
    }
    if (local_370.refcount != (int *)0x0) {
      LOCK();
      *local_370.refcount = *local_370.refcount + -1;
      UNLOCK();
      if (*local_370.refcount == 0) {
        if (local_370.allocator == (Allocator *)0x0) {
          if ((undefined8 *)local_370.data != (undefined8 *)0x0) {
            free(local_370.data);
          }
        }
        else {
          (**(code **)(*(long *)local_370.allocator + 0x18))();
        }
      }
    }
    if (local_330.refcount != (int *)0x0) {
      LOCK();
      *local_330.refcount = *local_330.refcount + -1;
      UNLOCK();
      if (*local_330.refcount == 0) {
        if (local_330.allocator == (Allocator *)0x0) {
          if ((undefined8 *)local_330.data != (undefined8 *)0x0) {
            free(local_330.data);
          }
        }
        else {
          (**(code **)(*(long *)local_330.allocator + 0x18))();
        }
      }
    }
  }
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if ((undefined8 *)local_f0.data != (undefined8 *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (**(code **)(*(long *)local_f0.allocator + 0x18))();
      }
    }
  }
  if (local_2f0.refcount != (int *)0x0) {
    LOCK();
    *local_2f0.refcount = *local_2f0.refcount + -1;
    UNLOCK();
    if (*local_2f0.refcount == 0) {
      if (local_2f0.allocator == (Allocator *)0x0) {
        if ((undefined8 *)local_2f0.data != (undefined8 *)0x0) {
          free(local_2f0.data);
        }
      }
      else {
        (**(code **)(*(long *)local_2f0.allocator + 0x18))();
      }
    }
  }
  if (local_b0.refcount != (int *)0x0) {
    LOCK();
    *local_b0.refcount = *local_b0.refcount + -1;
    UNLOCK();
    if (*local_b0.refcount == 0) {
      if (local_b0.allocator == (Allocator *)0x0) {
        if ((undefined8 *)local_b0.data != (undefined8 *)0x0) {
          free(local_b0.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b0.allocator + 0x18))();
      }
    }
  }
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        if (local_70.data != (void *)0x0) {
          free(local_70.data);
        }
      }
      else {
        (**(code **)(*(long *)local_70.allocator + 0x18))();
      }
    }
  }
  return uVar2;
}

Assistant:

static int test_crop_4()
{
    ncnn::Mat a = RandomMat(13, 11, 17);

    return 0
        || test_crop(a, IntArrayMat(0, 0, 0), IntArrayMat(100, 100, 100), IntArrayMat(0, 1, 2))
        || test_crop(a, IntArrayMat(4), IntArrayMat(8), IntArrayMat(0))
        || test_crop(a, IntArrayMat(2), IntArrayMat(7), IntArrayMat(1))
        || test_crop(a, IntArrayMat(3), IntArrayMat(5), IntArrayMat(2))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(0, 1))
        || test_crop(a, IntArrayMat(1, 4), IntArrayMat(-5, 7), IntArrayMat(1, -3))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(-1, -2))
        || test_crop(a, IntArrayMat(1, 2, 3), IntArrayMat(-3, -2, -1), IntArrayMat(-3, -2, -1))
        ;
}